

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall
ccs::CcsContext::CcsContext
          (CcsContext *this,CcsContext *parent,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  Key local_70;
  shared_ptr<const_ccs::SearchState> local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values_local;
  string *name_local;
  CcsContext *parent_local;
  CcsContext *this_local;
  
  local_28 = values;
  values_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)name;
  name_local = (string *)parent;
  parent_local = this;
  std::shared_ptr<ccs::SearchState_const>::shared_ptr<ccs::SearchState,void>
            ((shared_ptr<ccs::SearchState_const> *)&local_38,&parent->searchState);
  Key::Key(&local_70,(string *)values_local,local_28);
  SearchState::newChild((SearchState *)this,&local_38,&local_70);
  Key::~Key(&local_70);
  std::shared_ptr<const_ccs::SearchState>::~shared_ptr(&local_38);
  return;
}

Assistant:

CcsContext::CcsContext(const CcsContext &parent, const std::string &name,
    const std::vector<std::string> &values)
  : searchState(SearchState::newChild(parent.searchState, Key(name, values))) {}